

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

SquareMatrix<4> * __thiscall
pbrt::SquareMatrix<4>::operator/
          (SquareMatrix<4> *__return_storage_ptr__,SquareMatrix<4> *this,Float s)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  
  uVar2 = *(undefined8 *)(this->m[0] + 2);
  uVar3 = *(undefined8 *)this->m[1];
  uVar4 = *(undefined8 *)(this->m[1] + 2);
  uVar5 = *(undefined8 *)this->m[2];
  uVar6 = *(undefined8 *)(this->m[2] + 2);
  uVar7 = *(undefined8 *)this->m[3];
  uVar8 = *(undefined8 *)(this->m[3] + 2);
  auVar10._4_4_ = s;
  auVar10._0_4_ = s;
  auVar10._8_4_ = s;
  auVar10._12_4_ = s;
  lVar9 = 0;
  *(undefined8 *)__return_storage_ptr__->m[0] = *(undefined8 *)this->m[0];
  *(undefined8 *)(__return_storage_ptr__->m[0] + 2) = uVar2;
  *(undefined8 *)__return_storage_ptr__->m[1] = uVar3;
  *(undefined8 *)(__return_storage_ptr__->m[1] + 2) = uVar4;
  *(undefined8 *)__return_storage_ptr__->m[2] = uVar5;
  *(undefined8 *)(__return_storage_ptr__->m[2] + 2) = uVar6;
  *(undefined8 *)__return_storage_ptr__->m[3] = uVar7;
  *(undefined8 *)(__return_storage_ptr__->m[3] + 2) = uVar8;
  do {
    auVar1 = vdivps_avx(*(undefined1 (*) [16])((long)__return_storage_ptr__->m[0] + lVar9),auVar10);
    *(undefined1 (*) [16])((long)__return_storage_ptr__->m[0] + lVar9) = auVar1;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

operator/(Float s) const {
        DCHECK_NE(s, 0);
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] /= s;
        return r;
    }